

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g2d.c
# Opt level: O1

int g2d_polygon_rasterize(zarray_t *poly,double y,double *x)

{
  ulong uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  g2d_line_t line;
  g2d_line_segment_t seg;
  double q [2];
  g2d_line_t local_98;
  g2d_line_segment_t local_78;
  double local_48 [3];
  
  if (poly == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                  ,0x84,"int zarray_size(const zarray_t *)");
  }
  uVar2 = poly->size;
  local_98.p[0] = 0.0;
  local_98.u[0] = 1.0;
  dVar11 = y - y;
  fVar10 = (float)(dVar11 * dVar11 + 1.0);
  local_98.p[1] = y;
  if (fVar10 < 0.0) {
    local_98.u[1] = dVar11;
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  local_98.u[0] = 1.0 / (double)fVar10;
  local_98.u[1] = dVar11 / (double)fVar10;
  if ((int)uVar2 < 1) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    uVar5 = 0;
    do {
      if ((long)poly->size <= (long)uVar5) {
LAB_003f54f7:
        __assert_fail("idx < za->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/./common/zarray.h"
                      ,0xd9,"void zarray_get_volatile(const zarray_t *, int, void *)");
      }
      uVar1 = uVar5 + 1;
      uVar7 = (uint)uVar1;
      if ((ulong)uVar2 - 1 == uVar5) {
        uVar7 = 0;
      }
      if (poly->size <= (int)uVar7) goto LAB_003f54f7;
      pcVar3 = poly->data;
      lVar6 = uVar5 * poly->el_sz;
      lVar8 = (ulong)uVar7 * poly->el_sz;
      local_78.line.p[0] = *(double *)(pcVar3 + lVar6);
      local_78.line.p[1] = *(double *)(pcVar3 + lVar6 + 8);
      dVar11 = *(double *)(pcVar3 + lVar8) - local_78.line.p[0];
      dVar12 = *(double *)(pcVar3 + lVar8 + 8) - local_78.line.p[1];
      fVar10 = (float)(dVar12 * dVar12 + dVar11 * dVar11);
      if (fVar10 < 0.0) {
        local_78.line.u[0] = dVar11;
        local_78.line.u[1] = dVar12;
        fVar10 = sqrtf(fVar10);
      }
      else {
        fVar10 = SQRT(fVar10);
      }
      local_78.line.u[0] = dVar11 / (double)fVar10;
      local_78.line.u[1] = dVar12 / (double)fVar10;
      local_78.p1[0] = *(double *)(pcVar3 + lVar8);
      local_78.p1[1] = *(double *)(pcVar3 + lVar8 + 8);
      iVar4 = g2d_line_segment_intersect_line(&local_78,&local_98,local_48);
      if (iVar4 != 0) {
        lVar6 = (long)iVar9;
        iVar9 = iVar9 + 1;
        x[lVar6] = local_48[0];
      }
      uVar5 = uVar1;
    } while (uVar2 != uVar1);
  }
  qsort(x,(long)iVar9,8,double_sort_up);
  return iVar9;
}

Assistant:

int g2d_polygon_rasterize(const zarray_t *poly, double y, double *x)
{
    int sz = zarray_size(poly);

    g2d_line_t line;
    if (1) {
        double p0[2] = { 0, y };
        double p1[2] = { 1, y };

        g2d_line_init_from_points(&line, p0, p1);
    }

    int xpos = 0;

    for (int i = 0; i < sz; i++) {
        g2d_line_segment_t seg;
        double *p0, *p1;
        zarray_get_volatile(poly, i, &p0);
        zarray_get_volatile(poly, (i+1)%sz, &p1);

        g2d_line_segment_init_from_points(&seg, p0, p1);

        double q[2];
        if (g2d_line_segment_intersect_line(&seg, &line, q))
            x[xpos++] = q[0];
    }

    qsort(x, xpos, sizeof(double), double_sort_up);

    return xpos;
}